

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

psa_status_t psa_crypto_init(void)

{
  int ret;
  psa_status_t pVar1;
  uchar drbg_seed [4];
  uchar local_1c [4];
  
  builtin_memcpy(local_1c,"PSA",4);
  pVar1 = 0;
  if ((global_data._1392_1_ & 1) == 0) {
    if (global_data.entropy_init == (_func_void_mbedtls_entropy_context_ptr *)0x0) {
      global_data.entropy_init = mbedtls_entropy_init;
    }
    if (global_data.entropy_free == (_func_void_mbedtls_entropy_context_ptr *)0x0) {
      global_data.entropy_free = mbedtls_entropy_free;
    }
    (*global_data.entropy_init)((mbedtls_entropy_context *)0x152158);
    mbedtls_ctr_drbg_init(&global_data.ctr_drbg);
    global_data._1392_1_ = global_data._1392_1_ & 0xf9 | 2;
    ret = mbedtls_ctr_drbg_seed
                    (&global_data.ctr_drbg,mbedtls_entropy_func,&global_data.entropy,local_1c,3);
    pVar1 = mbedtls_to_psa_error(ret);
    if (pVar1 == 0) {
      global_data._1392_1_ = global_data._1392_1_ & 0xf9 | 4;
      pVar1 = psa_initialize_key_slots();
      if (pVar1 == 0) {
        global_data._1392_1_ = global_data._1392_1_ | 1;
        return 0;
      }
    }
    mbedtls_psa_crypto_free();
  }
  return pVar1;
}

Assistant:

psa_status_t psa_crypto_init( void )
{
    psa_status_t status;
    const unsigned char drbg_seed[] = "PSA";

    /* Double initialization is explicitly allowed. */
    if( global_data.initialized != 0 )
        return( PSA_SUCCESS );

    /* Set default configuration if
     * mbedtls_psa_crypto_configure_entropy_sources() hasn't been called. */
    if( global_data.entropy_init == NULL )
        global_data.entropy_init = mbedtls_entropy_init;
    if( global_data.entropy_free == NULL )
        global_data.entropy_free = mbedtls_entropy_free;

    /* Initialize the random generator. */
    global_data.entropy_init( &global_data.entropy );
#if defined(MBEDTLS_PSA_INJECT_ENTROPY) && \
    defined(MBEDTLS_NO_DEFAULT_ENTROPY_SOURCES)
    /* The PSA entropy injection feature depends on using NV seed as an entropy
     * source. Add NV seed as an entropy source for PSA entropy injection. */
    mbedtls_entropy_add_source( &global_data.entropy,
                                mbedtls_nv_seed_poll, NULL,
                                MBEDTLS_ENTROPY_BLOCK_SIZE,
                                MBEDTLS_ENTROPY_SOURCE_STRONG );
#endif
    mbedtls_ctr_drbg_init( &global_data.ctr_drbg );
    global_data.rng_state = RNG_INITIALIZED;
    status = mbedtls_to_psa_error(
        mbedtls_ctr_drbg_seed( &global_data.ctr_drbg,
                               mbedtls_entropy_func,
                               &global_data.entropy,
                               drbg_seed, sizeof( drbg_seed ) - 1 ) );
    if( status != PSA_SUCCESS )
        goto exit;
    global_data.rng_state = RNG_SEEDED;

    status = psa_initialize_key_slots( );
    if( status != PSA_SUCCESS )
        goto exit;

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    status = psa_init_all_se_drivers( );
    if( status != PSA_SUCCESS )
        goto exit;
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

#if defined(PSA_CRYPTO_STORAGE_HAS_TRANSACTIONS)
    status = psa_crypto_load_transaction( );
    if( status == PSA_SUCCESS )
    {
        status = psa_crypto_recover_transaction( &psa_crypto_transaction );
        if( status != PSA_SUCCESS )
            goto exit;
        status = psa_crypto_stop_transaction( );
    }
    else if( status == PSA_ERROR_DOES_NOT_EXIST )
    {
        /* There's no transaction to complete. It's all good. */
        status = PSA_SUCCESS;
    }
#endif /* PSA_CRYPTO_STORAGE_HAS_TRANSACTIONS */

    /* All done. */
    global_data.initialized = 1;

exit:
    if( status != PSA_SUCCESS )
        mbedtls_psa_crypto_free( );
    return( status );
}